

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrappers.pb.cc
# Opt level: O0

uint8_t * __thiscall
google::protobuf::DoubleValue::_InternalSerialize
          (DoubleValue *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  unsigned_long uVar2;
  UnknownFieldSet *unknown_fields;
  double value;
  double local_38;
  undefined4 local_2c;
  DoubleValue *pDStack_28;
  uint32_t cached_has_bits;
  DoubleValue *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  DoubleValue *this_local;
  
  local_2c = 0;
  pDStack_28 = this;
  this_ = (DoubleValue *)stream;
  stream_local = (EpsCopyOutputStream *)target;
  target_local = (uint8_t *)this;
  local_38 = _internal_value(this);
  uVar2 = absl::lts_20240722::bit_cast<unsigned_long,_double,_0>(&local_38);
  if (uVar2 != 0) {
    stream_local = (EpsCopyOutputStream *)
                   io::EpsCopyOutputStream::EnsureSpace
                             ((EpsCopyOutputStream *)this_,(uint8_t *)stream_local);
    value = _internal_value(pDStack_28);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::WriteDoubleToArray(1,value,(uint8_t *)stream_local);
  }
  bVar1 = internal::InternalMetadata::have_unknown_fields
                    (&(pDStack_28->super_Message).super_MessageLite._internal_metadata_);
  if (bVar1) {
    unknown_fields =
         internal::InternalMetadata::unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(pDStack_28->super_Message).super_MessageLite._internal_metadata_,
                    UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (unknown_fields,(uint8_t *)stream_local,(EpsCopyOutputStream *)this_);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* DoubleValue::_InternalSerialize(
            ::uint8_t* target,
            ::google::protobuf::io::EpsCopyOutputStream* stream) const {
          const DoubleValue& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
          // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.DoubleValue)
          ::uint32_t cached_has_bits = 0;
          (void)cached_has_bits;

          // double value = 1;
          if (::absl::bit_cast<::uint64_t>(this_._internal_value()) != 0) {
            target = stream->EnsureSpace(target);
            target = ::_pbi::WireFormatLite::WriteDoubleToArray(
                1, this_._internal_value(), target);
          }

          if (PROTOBUF_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
            target =
                ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
                    this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
          }
          // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.DoubleValue)
          return target;
        }